

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O3

void __thiscall duckdb::CSVSniffFunctionData::~CSVSniffFunctionData(CSVSniffFunctionData *this)

{
  pointer pcVar1;
  
  (this->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__CSVSniffFunctionData_01989330;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->names_csv);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->return_types_csv);
  CSVReaderOptions::~CSVReaderOptions(&this->options);
  pcVar1 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path).field_2) {
    operator_delete(pcVar1);
  }
  TableFunctionData::~TableFunctionData(&this->super_TableFunctionData);
  operator_delete(this);
  return;
}

Assistant:

CSVSniffFunctionData() {
	}